

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::SelectRows::dim_forward(SelectRows *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *this_00;
  invalid_argument *this_01;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  long in_RSI;
  Dim *in_RDI;
  uint nrows;
  Dim *os;
  uint in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  iterator in_stack_ffffffffffffffb8;
  size_type in_stack_ffffffffffffffc0;
  uint local_34;
  uint *local_30;
  undefined8 local_28;
  uint local_20;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_10;
  
  os = in_RDI;
  local_10 = in_RDX;
  sVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  if (sVar3 == 1) {
    pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
    uVar1 = Dim::ndims(pvVar4);
    if (uVar1 < 3) {
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RSI + 0x68));
      local_20 = (uint)sVar3;
      pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
      uVar1 = Dim::ndims(pvVar4);
      if (uVar1 == 1) {
        local_34 = local_20;
        local_30 = &local_34;
        local_28 = 1;
        x._M_len = in_stack_ffffffffffffffc0;
        x._M_array = in_stack_ffffffffffffffb8;
        Dim::Dim((Dim *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),x);
      }
      else {
        uVar1 = local_20;
        pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
        uVar2 = Dim::cols(pvVar4);
        x_00._M_len = 2;
        x_00._M_array = (iterator)&stack0xffffffffffffffb0;
        Dim::Dim((Dim *)CONCAT44(uVar2,uVar1),x_00);
      }
      return os;
    }
  }
  std::operator<<((ostream *)&std::cerr,"Bad arguments in SelectRows: ");
  this_00 = cnn::operator<<((ostream *)os,(vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)in_RDI);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"invalid arguments to SelectRows");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim SelectRows::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 1 || xs[0].ndims() > 2) {
    cerr << "Bad arguments in SelectRows: " << xs << endl;
    throw std::invalid_argument("invalid arguments to SelectRows");
  }
  unsigned nrows = prows->size();
  if (xs[0].ndims() == 1) return Dim({nrows});
  return Dim({nrows, xs[0].cols()});
}